

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

void __thiscall cppjieba::DictTrie::LoadDict(DictTrie *this,string *filePath)

{
  undefined1 *this_00;
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  ostream *poVar4;
  istream *piVar5;
  size_type sVar6;
  reference word;
  char *__nptr;
  reference tag;
  double weight;
  Logger local_618;
  allocator local_491;
  string local_490 [32];
  long local_470;
  size_t lineno;
  DictUnit node_info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buf;
  string line;
  Logger local_3b0;
  istream local_220 [8];
  ifstream ifs;
  string *filePath_local;
  DictTrie *this_local;
  
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,uVar3,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    limonp::Logger::Logger
              (&local_3b0,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/DictTrie.hpp"
               ,0xcb);
    poVar4 = limonp::Logger::Stream(&local_3b0);
    poVar4 = std::operator<<(poVar4,"exp: [ifs.is_open()");
    poVar4 = std::operator<<(poVar4,"] false. ");
    poVar4 = std::operator<<(poVar4,"open ");
    poVar4 = std::operator<<(poVar4,(string *)filePath);
    std::operator<<(poVar4," failed.");
    limonp::Logger::~Logger(&local_3b0);
  }
  std::__cxx11::string::string
            ((string *)
             &buf.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&node_info.field_0x78);
  DictUnit::DictUnit((DictUnit *)&lineno);
  local_470 = 0;
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (local_220,
                        (string *)
                        &buf.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar2) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_490," ",&local_491);
    limonp::Split((string *)
                  &buf.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&node_info.field_0x78,(string *)local_490,0xffffffffffffffff);
    std::__cxx11::string::~string(local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&node_info.field_0x78);
    if (sVar6 != 3) {
      limonp::Logger::Logger
                (&local_618,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/DictTrie.hpp"
                 ,0xd2);
      poVar4 = limonp::Logger::Stream(&local_618);
      poVar4 = std::operator<<(poVar4,"exp: [buf.size() == DICT_COLUMN_NUM");
      poVar4 = std::operator<<(poVar4,"] false. ");
      poVar4 = std::operator<<(poVar4,"split result illegal, line:");
      std::operator<<(poVar4,(string *)
                             &buf.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      limonp::Logger::~Logger(&local_618);
    }
    this_00 = &node_info.field_0x78;
    word = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_00,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00,1);
    __nptr = (char *)std::__cxx11::string::c_str();
    weight = atof(__nptr);
    tag = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this_00,2);
    MakeNodeInfo(this,(DictUnit *)&lineno,word,weight,tag);
    std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::push_back
              (&this->static_node_infos_,(value_type *)&lineno);
    local_470 = local_470 + 1;
  }
  DictUnit::~DictUnit((DictUnit *)&lineno);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&node_info.field_0x78);
  std::__cxx11::string::~string
            ((string *)
             &buf.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void LoadDict(const string& filePath) {
    ifstream ifs(filePath.c_str());
    XCHECK(ifs.is_open()) << "open " << filePath << " failed.";
    string line;
    vector<string> buf;

    DictUnit node_info;
    for (size_t lineno = 0; getline(ifs, line); lineno++) {
      Split(line, buf, " ");
      XCHECK(buf.size() == DICT_COLUMN_NUM) << "split result illegal, line:" << line;
      MakeNodeInfo(node_info, 
            buf[0], 
            atof(buf[1].c_str()), 
            buf[2]);
      static_node_infos_.push_back(node_info);
    }
  }